

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int fts3StringAppend(StrBuffer *pStr,char *zAppend,int nAppend)

{
  int iVar1;
  int iVar2;
  size_t sVar3;
  long lVar4;
  char *pOld;
  u64 nBytes;
  
  if (nAppend < 0) {
    sVar3 = strlen(zAppend);
    nAppend = (int)sVar3;
  }
  iVar2 = pStr->n;
  iVar1 = pStr->nAlloc;
  pOld = pStr->z;
  sVar3 = (size_t)nAppend;
  if (iVar1 <= nAppend + iVar2 + 1) {
    iVar2 = sqlite3_initialize();
    if (iVar2 != 0) {
      return 7;
    }
    nBytes = (long)iVar1 + sVar3 + 100;
    pOld = (char *)sqlite3Realloc(pOld,nBytes);
    if (pOld == (char *)0x0) {
      return 7;
    }
    pStr->z = pOld;
    pStr->nAlloc = (int)nBytes;
    iVar2 = pStr->n;
  }
  memcpy(pOld + iVar2,zAppend,sVar3);
  lVar4 = (long)pStr->n + sVar3;
  pStr->n = (int)lVar4;
  pStr->z[lVar4] = '\0';
  return 0;
}

Assistant:

static int fts3StringAppend(
  StrBuffer *pStr,                /* Buffer to append to */
  const char *zAppend,            /* Pointer to data to append to buffer */
  int nAppend                     /* Size of zAppend in bytes (or -1) */
){
  if( nAppend<0 ){
    nAppend = (int)strlen(zAppend);
  }

  /* If there is insufficient space allocated at StrBuffer.z, use realloc()
  ** to grow the buffer until so that it is big enough to accomadate the
  ** appended data.
  */
  if( pStr->n+nAppend+1>=pStr->nAlloc ){
    sqlite3_int64 nAlloc = pStr->nAlloc+(sqlite3_int64)nAppend+100;
    char *zNew = sqlite3_realloc64(pStr->z, nAlloc);
    if( !zNew ){
      return SQLITE_NOMEM;
    }
    pStr->z = zNew;
    pStr->nAlloc = nAlloc;
  }
  assert( pStr->z!=0 && (pStr->nAlloc >= pStr->n+nAppend+1) );

  /* Append the data to the string buffer. */
  memcpy(&pStr->z[pStr->n], zAppend, nAppend);
  pStr->n += nAppend;
  pStr->z[pStr->n] = '\0';

  return SQLITE_OK;
}